

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O2

bool hwl::statement(state *ps,Statement *psVal)

{
  bool bVar1;
  long lVar2;
  combinator local_150;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  undefined1 local_f0 [16];
  code *local_e0;
  code *local_d8;
  Statement *local_d0;
  code *local_c8;
  code *local_c0;
  code *local_b8;
  _Function_base local_b0;
  code *local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  undefined1 *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  local_130._M_unused._M_object = &local_b0;
  local_b0._M_functor._8_8_ = 0;
  local_b0._M_functor._M_unused._M_object = indent;
  local_98 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_b0._M_manager =
       std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  local_88 = 0;
  local_90 = dedent;
  local_78 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_80 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  local_70._M_unused._M_object = &local_130;
  local_130._8_8_ = 2;
  local_118 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
              ::_M_manager;
  local_110._M_unused._M_object = &local_70;
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_manager;
  local_48 = 0;
  local_50 = _;
  local_38 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_40 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  local_30 = local_f0;
  local_f0._8_8_ = call;
  local_d8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_manager;
  local_c8 = if_stmt;
  local_b8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_manager;
  local_28 = 2;
  local_18 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_manager;
  local_110._8_8_ = 3;
  local_f8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
              ::_M_manager;
  local_f0._0_8_ = psVal;
  local_d0 = psVal;
  parser::memoize<hwl::Statement>(&local_150,7,psVal,(combinator *)&local_110);
  bVar1 = std::function<bool_(parser::state_&)>::operator()(&local_150,ps);
  std::_Function_base::~_Function_base(&local_150.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  lVar2 = 0x40;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&local_70 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base((_Function_base *)(local_f0 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  lVar2 = 0x20;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&local_b0._M_functor + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return bVar1;
}

Assistant:

bool statement(parser::state& ps, Statement                & psVal) {
		return parser::memoize(7, psVal, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						indent,
						dedent})),
				_,
				
					parser::choice({
						parser::bind(psVal, call),
						parser::bind(psVal, if_stmt)})}))(ps);
	}